

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O0

void tEcJobTask(void *pvThreadParamDesc)

{
  CAtEmLogging *pCVar1;
  EC_T_INT nVerbose;
  undefined8 uVar2;
  EC_T_BYTE *pbyPDIn;
  EC_T_BYTE *pbyPDOut;
  EC_T_CHAR *local_38;
  EC_T_CHAR *pszLog;
  EC_T_BOOL bOk;
  EC_T_INT nOverloadCounter;
  EC_T_BOOL bPrevCycProcessed;
  EC_T_CPUSET CpuSet;
  T_DEMO_THREAD_PARAM *pDemoThreadParam;
  void *pvStack_10;
  EC_T_DWORD dwRes;
  void *pvThreadParamDesc_local;
  
  pDemoThreadParam._4_4_ = 0x98110000;
  bOk = 0;
  pszLog._4_4_ = 0;
  nOverloadCounter = 1 << ((byte)*(undefined4 *)((long)pvThreadParamDesc + 0x18) & 0x1f);
  _bPrevCycProcessed = pvThreadParamDesc;
  pvStack_10 = pvThreadParamDesc;
  pszLog._0_4_ = OsSetThreadAffinity(0,nOverloadCounter);
  if ((int)pszLog == 0) {
    CAtEmLogging::LogError
              (S_poLog,"Error: Set job task affinitiy, invalid CPU index %d\n",
               (ulong)*(uint *)((long)_bPrevCycProcessed + 0x18));
  }
  else {
    *(undefined4 *)((long)_bPrevCycProcessed + 4) = 1;
    do {
      OsWaitForEvent(*(undefined8 *)((long)_bPrevCycProcessed + 0x10),0xffffffff);
      ecatPerfMeasEnd(&S_TscMeasDesc,4);
      ecatPerfMeasStart(&S_TscMeasDesc,4);
      ecatPerfMeasStart(&S_TscMeasDesc,0);
      pDemoThreadParam._4_4_ = ecatExecJob(eUsrJob_ProcessAllRxFrames,&bOk);
      pCVar1 = S_poLog;
      if (((pDemoThreadParam._4_4_ != 0) && (pDemoThreadParam._4_4_ != 0x9811000e)) &&
         (pDemoThreadParam._4_4_ != 0x9811002d)) {
        uVar2 = ecatGetText(pDemoThreadParam._4_4_);
        CAtEmLogging::LogError
                  (pCVar1,"ERROR: ecatExecJob( eUsrJob_ProcessAllRxFrames): %s (0x%lx)",uVar2,
                   (ulong)pDemoThreadParam._4_4_);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,0);
      if (pDemoThreadParam._4_4_ == 0) {
        if (bOk == 0) {
          pszLog._4_4_ = pszLog._4_4_ + 10;
          if (pszLog._4_4_ < 0x32) {
            CAtEmLogging::LogError
                      (S_poLog,
                       "eUsrJob_ProcessAllRxFrames - not all previously sent frames are received/processed (frame loss)!"
                      );
          }
          else {
            CAtEmLogging::LogError
                      (S_poLog,"Error: System overload: Cycle time too short or huge jitter!");
          }
        }
        else if (0 < pszLog._4_4_) {
          pszLog._4_4_ = pszLog._4_4_ + -1;
        }
      }
      ecatPerfMeasStart(&S_TscMeasDesc,6);
      local_38 = (EC_T_CHAR *)0x0;
      ecatDcmGetLog(&local_38);
      if (local_38 != (EC_T_CHAR *)0x0) {
        CAtEmLogging::LogDcm(S_poLog,local_38);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,6);
      ecatPerfMeasStart(&S_TscMeasDesc,5);
      pCVar1 = *(CAtEmLogging **)((long)_bPrevCycProcessed + 0x20);
      nVerbose = CEmNotification::Verbose(*(CEmNotification **)((long)_bPrevCycProcessed + 0x28));
      pbyPDIn = ecatGetProcessImageInputPtr();
      pbyPDOut = ecatGetProcessImageOutputPtr();
      myAppWorkpd(pCVar1,nVerbose,pbyPDIn,pbyPDOut);
      ecatPerfMeasEnd(&S_TscMeasDesc,5);
      ecatPerfMeasStart(&S_TscMeasDesc,1);
      pDemoThreadParam._4_4_ = ecatExecJob(eUsrJob_SendAllCycFrames,(EC_T_PVOID)0x0);
      pCVar1 = S_poLog;
      if (((pDemoThreadParam._4_4_ != 0) && (pDemoThreadParam._4_4_ != 0x9811000e)) &&
         (pDemoThreadParam._4_4_ != 0x9811002d)) {
        uVar2 = ecatGetText(pDemoThreadParam._4_4_);
        CAtEmLogging::LogError
                  (pCVar1,"ecatExecJob( eUsrJob_SendAllCycFrames,    EC_NULL ): %s (0x%lx)",uVar2,
                   (ulong)pDemoThreadParam._4_4_);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,1);
      if (pDemoThreadParam._4_4_ == 0x98110038) {
        bRun = 0;
      }
      ecatPerfMeasStart(&S_TscMeasDesc,2);
      pDemoThreadParam._4_4_ = ecatExecJob(eUsrJob_MasterTimer,(EC_T_PVOID)0x0);
      pCVar1 = S_poLog;
      if ((pDemoThreadParam._4_4_ != 0) && (pDemoThreadParam._4_4_ != 0x9811000e)) {
        uVar2 = ecatGetText(pDemoThreadParam._4_4_);
        CAtEmLogging::LogError
                  (pCVar1,"ecatExecJob(eUsrJob_MasterTimer, EC_NULL): %s (0x%lx)",uVar2,
                   (ulong)pDemoThreadParam._4_4_);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,2);
      ecatPerfMeasStart(&S_TscMeasDesc,3);
      pDemoThreadParam._4_4_ = ecatExecJob(eUsrJob_SendAcycFrames,(EC_T_PVOID)0x0);
      pCVar1 = S_poLog;
      if (((pDemoThreadParam._4_4_ != 0) && (pDemoThreadParam._4_4_ != 0x9811000e)) &&
         (pDemoThreadParam._4_4_ != 0x9811002d)) {
        uVar2 = ecatGetText(pDemoThreadParam._4_4_);
        CAtEmLogging::LogError
                  (pCVar1,"ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL): %s (0x%lx)",uVar2,
                   (ulong)pDemoThreadParam._4_4_);
      }
      ecatPerfMeasEnd(&S_TscMeasDesc,3);
    } while (*(int *)((long)_bPrevCycProcessed + 8) == 0);
    ecatPerfMeasShow(&S_TscMeasDesc,0xffffffff,S_aszMeasInfo);
    *(undefined4 *)((long)_bPrevCycProcessed + 4) = 0;
  }
  return;
}

Assistant:

static EC_T_VOID tEcJobTask(EC_T_VOID* pvThreadParamDesc)
{
    EC_T_DWORD           dwRes             = EC_E_ERROR;
    T_DEMO_THREAD_PARAM* pDemoThreadParam  = (T_DEMO_THREAD_PARAM*)pvThreadParamDesc;
    EC_T_CPUSET          CpuSet;
    EC_T_BOOL            bPrevCycProcessed = EC_FALSE;
    EC_T_INT             nOverloadCounter  = 0;               /* counter to check if cycle time is to short */
    EC_T_BOOL            bOk;

    EC_CPUSET_ZERO(CpuSet);
    EC_CPUSET_SET(CpuSet, pDemoThreadParam->dwCpuIndex);
    bOk = OsSetThreadAffinity(EC_NULL, CpuSet);
    if (!bOk)
    {
        LogError("Error: Set job task affinitiy, invalid CPU index %d\n", pDemoThreadParam->dwCpuIndex);
        goto Exit;
    }

    /* Start periodic task right before where it is used,
     * otherwise, OsSleepTillTick() might fail if this thread is suspended before being able to call OsMakeThreadPeriodic() */
#if (defined XENOMAI)
    OsMakeThreadPeriodic(rt_task_self(), pDemoThreadParam->dwBusCycleTimeUsec);
#endif

    /* demo loop */
    pDemoThreadParam->bJobThreadRunning = EC_TRUE;
    do
    {
        /* wait for next cycle (event from scheduler task) */
#if (defined RTAI) || (defined XENOMAI)
        OsSleepTillTick(); /* period is set after creating jobtask */
#else
        OsWaitForEvent(pDemoThreadParam->pvTimingEvent, EC_WAITINFINITE);
#endif /* !RTAI && !XENOMAI*/

        PERF_JOB_END(PERF_CycleTime);
        PERF_JOB_START(PERF_CycleTime);

        /* process all received frames (read new input values) */
        PERF_JOB_START(JOB_ProcessAllRxFrames);
        dwRes = ecatExecJob(eUsrJob_ProcessAllRxFrames, &bPrevCycProcessed);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ERROR: ecatExecJob( eUsrJob_ProcessAllRxFrames): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_ProcessAllRxFrames);

        if (EC_E_NOERROR == dwRes)
        {
            if (!bPrevCycProcessed)
            {
                /* it is not reasonable, that more than 5 continuous frames are lost */
                nOverloadCounter += 10;
                if (nOverloadCounter >= 50)
                {
                    LogError( "Error: System overload: Cycle time too short or huge jitter!" );
                }
                else
                {
                    LogError( "eUsrJob_ProcessAllRxFrames - not all previously sent frames are received/processed (frame loss)!" );
                }
            }
            else
            {
                /* everything o.k.? If yes, decrement overload counter */
                if (nOverloadCounter > 0)    nOverloadCounter--;
            }
        }
        /* handle DCM logging */
#ifdef DCM_ENABLE_LOGFILE
        PERF_JOB_START(PERF_DCM_Logfile);
        {
            EC_T_CHAR* pszLog = EC_NULL;

            ecatDcmGetLog(&pszLog);
            if (EC_NULL != pszLog)
            {
                LogDcm(pszLog);
            }
        }
        PERF_JOB_END(PERF_DCM_Logfile);
#endif

        /*****************************************************/
        /* Demo code: Remove/change this in your application: Working process data cyclic call */
        /*****************************************************/
        PERF_JOB_START(PERF_myAppWorkpd);
        myAppWorkpd(pDemoThreadParam->pLogInst, pDemoThreadParam->pNotInst->Verbose(), ecatGetProcessImageInputPtr(), ecatGetProcessImageOutputPtr());
        PERF_JOB_END(PERF_myAppWorkpd);

        /* write output values of current cycle, by sending all cyclic frames */
        PERF_JOB_START(JOB_SendAllCycFrames);
        dwRes = ecatExecJob( eUsrJob_SendAllCycFrames, EC_NULL );
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ecatExecJob( eUsrJob_SendAllCycFrames,    EC_NULL ): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_SendAllCycFrames);

        /* remove this code when using licensed version */
        if (EC_E_EVAL_EXPIRED == dwRes )
        {
            bRun = EC_FALSE;        /* set shutdown flag */
        }

        /* Execute some administrative jobs. No bus traffic is performed by this function */
        PERF_JOB_START(JOB_MasterTimer);
        dwRes = ecatExecJob(eUsrJob_MasterTimer, EC_NULL);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes)
        {
            LogError("ecatExecJob(eUsrJob_MasterTimer, EC_NULL): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_MasterTimer);

        /* send queued acyclic EtherCAT frames */
        PERF_JOB_START(JOB_SendAcycFrames);
        dwRes = ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_SendAcycFrames);

#if !(defined NO_OS)
    } while (!pDemoThreadParam->bJobThreadShutdown);

    PERF_MEASURE_JOBS_SHOW();

    pDemoThreadParam->bJobThreadRunning = EC_FALSE;
#else
    /* in case of NO_OS the job task function is called cyclically within the timer ISR */
    }